

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oscurses.cc
# Opt level: O0

void os_expause(void)

{
  char *unaff_retaddr;
  
  if (((globalApp->options).exitPause & 1U) != 0) {
    os_printz(unaff_retaddr);
    os_flush();
    os_waitc();
  }
  return;
}

Assistant:

void
os_expause( void )
{
    if (globalApp->options.exitPause) {
        // Exit-pause is enabled.  Tell the user, flush any
        // pending output and wait for a key.
        os_printz("[Hit any key to exit.]");
        os_flush();
        os_waitc();
    }
}